

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::dht_tracker::update_node_id(dht_tracker *this,listen_socket_handle *s)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  
  p_Var3 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      bVar4 = p_Var3[1]._M_parent <
              (_Base_ptr)
              (s->m_sock).
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (!bVar4) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar4];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var3 = p_Var2,
     (_Base_ptr)
     (s->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi < p_Var2[1]._M_parent)) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    dht::node::update_node_id((node *)&p_Var3[1]._M_left);
  }
  update_storage_node_ids(this);
  return;
}

Assistant:

void dht_tracker::update_node_id(aux::listen_socket_handle const& s)
	{
		auto n = m_nodes.find(s);
		if (n != m_nodes.end())
			n->second.dht.update_node_id();
		update_storage_node_ids();
	}